

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O1

void cpostfx(int pm)

{
  boolean bVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  int *piVar8;
  char *pcVar9;
  int *piVar10;
  int iVar11;
  int iVar12;
  char buf [256];
  char local_138 [264];
  
  if (eatmbuf != (char *)0x0) {
    eatmdone();
  }
  if (pm < 0xec) {
    if (0x79 < pm) {
      if (pm < 0x83) {
        if (pm != 0x7a) {
          if (pm == 0x82) goto LAB_00194e9b;
          goto switchD_001945bd_caseD_111;
        }
      }
      else if (pm != 0x83) {
        if (pm != 0x9e) {
          if (pm == 0xd8) {
            pline("Your velocity suddenly seems very uncertain!");
            if ((u.uprops[0x1a].intrinsic & 0x7000000) == 0) {
              u.uprops[0x1a].intrinsic = u.uprops[0x1a].intrinsic | 0x4000000;
              pcVar9 = "You seem faster.";
            }
            else {
              u.uprops[0x1a].intrinsic = u.uprops[0x1a].intrinsic & 0xf8ffffff;
              pcVar9 = "You seem slower.";
            }
            pline(pcVar9);
            return;
          }
          goto switchD_001945bd_caseD_111;
        }
        if (((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
             (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
           (u.uprops[0xd].blocked == 0)) {
          if ((u.uprops[0xd].intrinsic & 0x7000000) == 0) {
            pline("You feel hidden!");
          }
          u.uprops[0xd].intrinsic = u.uprops[0xd].intrinsic | 0x4000000;
          u.uprops[0xc].intrinsic._3_1_ = u.uprops[0xc].intrinsic._3_1_ | 4;
        }
        else {
          uVar3 = mt_random();
          set_itimeout(&u.uprops[0xd].intrinsic,(ulong)(uVar3 % 100 + 0x32));
          if ((((u.uprops[0x1e].intrinsic == 0) &&
               (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
              ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
             (u.uprops[0xd].blocked == 0)) {
            self_invis_message();
          }
        }
        newsym((int)u.ux,(int)u.uy);
      }
      make_stunned((ulong)(u.uprops[0x1b].intrinsic + 0x1e),'\0');
LAB_00194e9b:
      make_stunned((ulong)(u.uprops[0x1b].intrinsic + 0x1e),'\0');
      return;
    }
    if (pm < 0x42) {
      if (pm - 0x31U < 2) {
        if (u.acurr.a[1] < urace.attrmax[1]) {
          uVar3 = mt_random();
          if ((uVar3 & 1) == 0) {
            pline("Yum! That was real brain food!");
            adjattrib(1,1,'\0',0);
            return;
          }
        }
        else {
          pline("For some reason, that tasted bland.");
        }
      }
      else {
        iVar4 = -0x14;
        if (pm == 0x41) goto LAB_00194a5f;
      }
    }
    else {
      if (pm == 0x42) {
        iVar4 = -0x28;
LAB_00194a5f:
        if ((youmonst.data)->mlet == '\r') {
          return;
        }
        if (u.uprops[0x3d].intrinsic == 0) {
          if (u.uprops[0x3d].extrinsic == 0) {
            pcVar9 = "a pile of gold";
            if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
              if (u.umonnum == u.umonster) {
                pcVar9 = "an orange";
              }
              else {
                bVar1 = dmgtype(youmonst.data,0x24);
                pcVar9 = "a pile of gold";
                if (bVar1 == '\0') {
                  pcVar9 = "an orange";
                }
              }
            }
            pline("You can\'t resist the temptation to mimic %s.",pcVar9);
            if (u.usteed != (monst *)0x0) {
              dismount_steed(1);
            }
            nomul(iVar4,"pretending to be a pile of gold");
            pcVar9 = "You now prefer mimicking %s again.";
            if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
              if (u.umonnum == u.umonster) {
                pcVar9 = "You suddenly dread being peeled and mimic %s again!";
              }
              else {
                bVar1 = dmgtype(youmonst.data,0x24);
                pcVar9 = "You now prefer mimicking %s again.";
                if (bVar1 == '\0') {
                  pcVar9 = "You suddenly dread being peeled and mimic %s again!";
                }
              }
            }
            pcVar6 = urace.noun;
            if (u.umonnum != u.umonster) {
              pcVar6 = mons_mname(youmonst.data);
            }
            pcVar6 = an(pcVar6);
            sprintf(local_138,pcVar9,pcVar6);
            sVar5 = strlen(local_138);
            pcVar9 = (char *)malloc(sVar5 + 1);
            strcpy(pcVar9,local_138);
            afternmv = eatmdone;
            youmonst.m_ap_type = '\x02';
            uVar3 = 0x1ef;
            nomovemsg = pcVar9;
            eatmbuf = pcVar9;
            if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
               (uVar3 = 0x117, u.umonnum != u.umonster)) {
              bVar1 = dmgtype(youmonst.data,0x24);
              uVar3 = 0x1ef;
              if (bVar1 == '\0') {
                uVar3 = 0x117;
              }
            }
            youmonst.mappearance = uVar3;
            newsym((int)u.ux,(int)u.uy);
            flush_screen();
            (*windowprocs.win_pause)(P_MAP);
            return;
          }
          return;
        }
        return;
      }
      if (pm == 0x43) {
        iVar4 = -0x32;
        goto LAB_00194a5f;
      }
    }
    goto switchD_001945bd_caseD_111;
  }
  if (0x14e < pm) {
    if (pm == 0x155) goto switchD_001945bd_caseD_117;
    if (pm == 0x154) {
      if (2 < u.uprops[0x1b].intrinsic) {
        make_stunned(2,'\0');
      }
      if (2 < u.uprops[0x1c].intrinsic) {
        make_confused(2,'\0');
        return;
      }
      return;
    }
    if (pm == 0x14f) {
      uVar3 = mt_random();
      iVar4 = u.uen;
      if ((uVar3 * -0x55555555 < 0x55555556) &&
         (iVar11 = u.uen * 3,
         iVar11 != u.uenmax * 2 && SBORROW4(iVar11,u.uenmax * 2) == iVar11 + u.uenmax * -2 < 0)) {
        return;
      }
      uVar3 = mt_random();
      u.uen = uVar3 % 3 + u.uen + 1;
      if (u.uenmax < u.uen) {
        uVar3 = mt_random();
        if (uVar3 * -0x55555555 < 0x55555556) {
          u.uenmax = u.uenmax + 1;
        }
        u.uen = u.uenmax;
      }
      if (iVar4 != u.uen) {
        pline("You feel a mild buzz.");
        iflags.botl = '\x01';
        return;
      }
      return;
    }
    goto switchD_001945bd_caseD_111;
  }
  switch(pm) {
  case 0x10e:
    u.ulycn = 0x5d;
    break;
  case 0x10f:
    u.ulycn = 0x11;
    break;
  case 0x110:
    u.ulycn = 0x17;
    break;
  case 0x111:
  case 0x112:
  case 0x113:
  case 0x114:
  case 0x115:
  case 0x116:
  case 0x118:
    goto switchD_001945bd_caseD_111;
  case 0x117:
switchD_001945bd_caseD_117:
    if (u.uprops[0x3d].extrinsic == 0 && u.uprops[0x3d].intrinsic == 0) {
      pline("You feel a change coming over you.");
      polyself('\0');
      return;
    }
    return;
  case 0x119:
    piVar8 = &u.mhmax;
    piVar10 = &u.uhp;
    if (u.umonnum == u.umonster) {
      piVar8 = &u.uhpmax;
    }
    else {
      piVar10 = &u.mh;
    }
    *piVar10 = *piVar8;
    iflags.botl = '\x01';
    return;
  default:
    if (pm == 0xec) {
      pluslvl('\0');
      return;
    }
switchD_001945bd_caseD_111:
    bVar1 = dmgtype(mons + pm,0xc);
    if (((bVar1 != '\0') || (bVar1 = dmgtype(mons + pm,0x24), pm == 0xa9)) || (bVar1 != '\0')) {
      pline("Oh wow!  Great stuff!");
      make_hallucinated((ulong)(u.uprops[0x23].intrinsic + 200),'\0',0);
    }
    if ((mons[pm].mflags2 & 0x4000) != 0) {
      gainstr((obj *)0x0,0,'\0');
    }
    iVar12 = 1;
    iVar11 = 0;
    iVar4 = 0;
    do {
      uVar3 = 0;
      switch(iVar12) {
      case 1:
        uVar3 = (uint)mons[pm].mconveys;
        goto LAB_001949ca;
      case 2:
        uVar3 = mons[pm].mconveys & 2;
        break;
      case 3:
        uVar3 = mons[pm].mconveys & 4;
        break;
      case 4:
        uVar3 = mons[pm].mconveys & 8;
        break;
      case 5:
        uVar3 = mons[pm].mconveys & 0x10;
        break;
      case 6:
        uVar3 = mons[pm].mconveys & 0x20;
        break;
      case 7:
      case 8:
      case 9:
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
        break;
      case 0xe:
        uVar3 = mons[pm].mflags1 >> 0x19;
        goto LAB_001949ca;
      case 0xf:
        uVar3 = mons[pm].mflags1 >> 0x1a;
LAB_001949ca:
        uVar3 = uVar3 & 1;
        break;
      default:
        uVar3 = 0;
        if (iVar12 == 0x19) {
          uVar3 = (uint)(pm - 0x31U < 2 || pm == 0x1e);
        }
      }
      if (uVar3 != 0) {
        iVar11 = iVar11 + 1;
        uVar3 = mt_random();
        if (SUB168(ZEXT416(uVar3) % SEXT816((long)iVar11),0) == 0) {
          iVar4 = iVar12;
        }
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 != 0x43);
    if (iVar11 == 0) {
      return;
    }
    if (iVar4 < 0xf) {
      if (iVar4 == 6) {
        if (((pm != 0x65) && (pm != 1)) || (uVar3 = mt_random(), (uVar3 & 3) != 0))
        goto LAB_00194db2;
LAB_00194b60:
        uVar7 = 1;
      }
      else {
        uVar7 = 10;
        if (iVar4 != 0xe) {
LAB_00194db2:
          uVar7 = 0xf;
        }
      }
    }
    else {
      if (iVar4 != 0xf) {
        if (iVar4 == 0x19) goto LAB_00194b60;
        goto LAB_00194db2;
      }
      uVar7 = 0xc;
    }
    cVar2 = mons[pm].mlevel;
    uVar3 = mt_random();
    if ((int)cVar2 <= (int)((ulong)uVar3 % uVar7)) {
      return;
    }
    switch(iVar4) {
    case 1:
      if ((u.uprops[1].intrinsic._3_1_ & 4) == 0) {
        pcVar9 = "You feel a momentary chill.";
        if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
          if (u.umonnum == u.umonster) {
            pcVar9 = "You be chillin\'.";
          }
          else {
            bVar1 = dmgtype(youmonst.data,0x24);
            pcVar9 = "You feel a momentary chill.";
            if (bVar1 == '\0') {
              pcVar9 = "You be chillin\'.";
            }
          }
        }
        pline(pcVar9);
        u.uprops[1].intrinsic._3_1_ = u.uprops[1].intrinsic._3_1_ | 4;
        return;
      }
      return;
    case 2:
      if ((u.uprops[2].intrinsic._3_1_ & 4) == 0) {
        pline("You feel full of hot air.");
        u.uprops[2].intrinsic._3_1_ = u.uprops[2].intrinsic._3_1_ | 4;
        return;
      }
      return;
    case 3:
      if ((u.uprops[3].intrinsic._3_1_ & 4) == 0) {
        pline("You feel wide awake.");
        u.uprops[3].intrinsic._3_1_ = u.uprops[3].intrinsic._3_1_ | 4;
        return;
      }
      return;
    case 4:
      if ((u.uprops[4].intrinsic._3_1_ & 4) == 0) {
        pcVar9 = "You feel very firm.";
        if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
          if (u.umonnum == u.umonster) {
            pcVar9 = "You feel totally together, man.";
          }
          else {
            bVar1 = dmgtype(youmonst.data,0x24);
            pcVar9 = "You feel very firm.";
            if (bVar1 == '\0') {
              pcVar9 = "You feel totally together, man.";
            }
          }
        }
        pline(pcVar9);
        u.uprops[4].intrinsic._3_1_ = u.uprops[4].intrinsic._3_1_ | 4;
        return;
      }
      return;
    case 5:
      if ((u.uprops[5].intrinsic._3_1_ & 4) == 0) {
        if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
           ((pcVar9 = "You feel grounded in reality.", u.umonnum != u.umonster &&
            (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) {
          pcVar9 = "Your health currently feels amplified!";
        }
        pline(pcVar9);
        u.uprops[5].intrinsic._3_1_ = u.uprops[5].intrinsic._3_1_ | 4;
        return;
      }
      return;
    case 6:
      if ((u.uprops[6].intrinsic >> 0x1a & 1) == 0) {
        pcVar9 = "You feel healthy.";
        if ((youmonst.mintrinsics & 0x20) != 0) {
          pcVar9 = "You feel especially healthy.";
        }
        if (u.uprops[6].intrinsic != 0 || u.uprops[6].extrinsic != 0) {
          pcVar9 = "You feel especially healthy.";
        }
        pline(pcVar9);
        u.uprops[6].intrinsic = u.uprops[6].intrinsic | 0x4000000;
        return;
      }
      return;
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
      return;
    case 0xe:
      if ((u.uprops[0xe].intrinsic._3_1_ & 4) == 0) {
        pcVar9 = "You feel very jumpy.";
        if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
          if (u.umonnum == u.umonster) {
            pcVar9 = "You feel diffuse.";
          }
          else {
            bVar1 = dmgtype(youmonst.data,0x24);
            pcVar9 = "You feel very jumpy.";
            if (bVar1 == '\0') {
              pcVar9 = "You feel diffuse.";
            }
          }
        }
        pline(pcVar9);
        u.uprops[0xe].intrinsic._3_1_ = u.uprops[0xe].intrinsic._3_1_ | 4;
        return;
      }
      return;
    case 0xf:
      if ((u.uprops[0xf].intrinsic._3_1_ & 4) == 0) {
        pcVar9 = "You feel in control of yourself.";
        if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
          if (u.umonnum == u.umonster) {
            pcVar9 = "You feel centered in your personal space.";
          }
          else {
            bVar1 = dmgtype(youmonst.data,0x24);
            pcVar9 = "You feel in control of yourself.";
            if (bVar1 == '\0') {
              pcVar9 = "You feel centered in your personal space.";
            }
          }
        }
        pline(pcVar9);
        u.uprops[0xf].intrinsic._3_1_ = u.uprops[0xf].intrinsic._3_1_ | 4;
        return;
      }
      return;
    }
    if (iVar4 != 0x19) {
      return;
    }
    if ((u.uprops[0x19].intrinsic._3_1_ & 4) != 0) {
      return;
    }
    if (u.uprops[0x19].blocked == 0) {
      if (u.uprops[0x24].extrinsic != 0 || u.uprops[0x23].intrinsic == 0) {
LAB_0019517e:
        pcVar9 = "You feel a strange mental acuity.";
        goto LAB_001952b0;
      }
      if (u.umonnum == u.umonster) {
        pcVar9 = "You feel in touch with the cosmos.";
        goto LAB_001952b0;
      }
      cVar2 = dmgtype(youmonst.data,0x24);
      pcVar6 = "You feel in touch with the cosmos.";
      pcVar9 = "You feel a strange mental acuity.";
    }
    else {
      if (u.uprops[0x24].extrinsic != 0 || u.uprops[0x23].intrinsic == 0) {
        pcVar9 = "You feel a dull aching inside your head.";
        goto LAB_001952b0;
      }
      if (u.umonnum == u.umonster) goto LAB_0019517e;
      cVar2 = dmgtype(youmonst.data,0x24);
      pcVar6 = "You feel a strange mental acuity.";
      pcVar9 = "You feel a dull aching inside your head.";
    }
    if (cVar2 == '\0') {
      pcVar9 = pcVar6;
    }
LAB_001952b0:
    pline(pcVar9);
    u.uprops[0x19].intrinsic._3_1_ = u.uprops[0x19].intrinsic._3_1_ | 4;
    if (((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
       (((youmonst.data)->mflags1 & 0x1000) == 0)) {
      return;
    }
    if ((ublindf != (obj *)0x0) && (ublindf->oartifact == '\x1d')) {
      return;
    }
    see_monsters();
    return;
  }
  bVar1 = defends(0x1d,uwep);
  if ((bVar1 != '\0') && (iVar4 = touch_artifact(uwep,&youmonst), iVar4 == 0)) {
    dropx(uwep);
    uwepgone();
    return;
  }
  return;
}

Assistant:

static void cpostfx(int pm)	/* called after completely consuming a corpse */
{
	int tmp = 0;
	boolean catch_lycanthropy = FALSE;

	/* in case `afternmv' didn't get called for previously mimicking
	   gold, clean up now to avoid `eatmbuf' memory leak */
	if (eatmbuf) eatmdone();

	switch(pm) {
	    case PM_NEWT:
		/* MRKR: "eye of newt" may give small magical energy boost */
		if (rn2(3) || 3 * u.uen <= 2 * u.uenmax) {
		    int old_uen = u.uen;
		    u.uen += rnd(3);
		    if (u.uen > u.uenmax) {
			if (!rn2(3)) u.uenmax++;
			u.uen = u.uenmax;
		    }
		    if (old_uen != u.uen) {
			    pline("You feel a mild buzz.");
			    iflags.botl = 1;
		    }
		}
		break;
	    case PM_WRAITH:
		pluslvl(FALSE);
		break;
	    case PM_HUMAN_WERERAT:
		catch_lycanthropy = TRUE;
		u.ulycn = PM_WERERAT;
		break;
	    case PM_HUMAN_WEREJACKAL:
		catch_lycanthropy = TRUE;
		u.ulycn = PM_WEREJACKAL;
		break;
	    case PM_HUMAN_WEREWOLF:
		catch_lycanthropy = TRUE;
		u.ulycn = PM_WEREWOLF;
		break;
	    case PM_NURSE:
		if (Upolyd) u.mh = u.mhmax;
		else u.uhp = u.uhpmax;
		iflags.botl = 1;
		break;
	    case PM_STALKER:
		if (!Invis) {
			set_itimeout(&HInvis, (long)rn1(100, 50));
			if (!Blind && !BInvis) self_invis_message();
		} else {
			if (!(HInvis & INTRINSIC)) pline("You feel hidden!");
			HInvis |= FROMOUTSIDE;
			HSee_invisible |= FROMOUTSIDE;
		}
		newsym(u.ux, u.uy);
		/* fall into next case */
	    case PM_YELLOW_LIGHT:
		/* fall into next case */
	    case PM_GIANT_BAT:
		make_stunned(HStun + 30,FALSE);
		/* fall into next case */
	    case PM_BAT:
		make_stunned(HStun + 30,FALSE);
		break;
	    case PM_GIANT_MIMIC:
		tmp += 10;
		/* fall into next case */
	    case PM_LARGE_MIMIC:
		tmp += 20;
		/* fall into next case */
	    case PM_SMALL_MIMIC:
		tmp += 20;
		if (youmonst.data->mlet != S_MIMIC && !Unchanging) {
		    char buf[BUFSZ];
		    pline("You can't resist the temptation to mimic %s.",
			Hallucination ? "an orange" : "a pile of gold");
                    /* A pile of gold can't ride. */
		    if (u.usteed) dismount_steed(DISMOUNT_FELL);
		    nomul(-tmp, "pretending to be a pile of gold");
		    sprintf(buf, Hallucination ?
			"You suddenly dread being peeled and mimic %s again!" :
			"You now prefer mimicking %s again.",
			an(Upolyd ? mons_mname(youmonst.data) : urace.noun));
		    eatmbuf = strcpy(malloc(strlen(buf) + 1), buf);
		    nomovemsg = eatmbuf;
		    afternmv = eatmdone;
		    /* ??? what if this was set before? */
		    youmonst.m_ap_type = M_AP_OBJECT;
		    youmonst.mappearance = Hallucination ? ORANGE : GOLD_PIECE;
		    newsym(u.ux,u.uy);
		    flush_screen();
		    /* make gold symbol show up now */
		    win_pause_output(P_MAP);
		}
		break;
	    case PM_QUANTUM_MECHANIC:
		pline("Your velocity suddenly seems very uncertain!");
		if (HFast & INTRINSIC) {
			HFast &= ~INTRINSIC;
			pline("You seem slower.");
		} else {
			HFast |= FROMOUTSIDE;
			pline("You seem faster.");
		}
		break;
	    case PM_LIZARD:
		if (HStun > 2)  make_stunned(2L,FALSE);
		if (HConfusion > 2)  make_confused(2L,FALSE);
		break;
	    case PM_CHAMELEON:
	    case PM_DOPPELGANGER:
	 /* case PM_SANDESTIN: */
		if (!Unchanging) {
		    pline("You feel a change coming over you.");
		    polyself(FALSE);
		}
		break;
	    case PM_MIND_FLAYER:
	    case PM_MASTER_MIND_FLAYER:
		if (ABASE(A_INT) < ATTRMAX(A_INT)) {
			if (!rn2(2)) {
				pline("Yum! That was real brain food!");
				adjattrib(A_INT, 1, FALSE, 0);
				break;	/* don't give them telepathy, too */
			}
		}
		else {
			pline("For some reason, that tasted bland.");
		}
		/* fall through to default case */
	    default: {
		const struct permonst *ptr = &mons[pm];
		int i, count;

		if (dmgtype(ptr, AD_STUN) || dmgtype(ptr, AD_HALU) ||
		    pm == PM_VIOLET_FUNGUS) {
			pline ("Oh wow!  Great stuff!");
			make_hallucinated(HHallucination + 200,FALSE,0L);
		}
		if (is_giant(ptr)) gainstr(NULL, 0, FALSE);

		/* Check the monster for all of the intrinsics.  If this
		 * monster can give more than one, pick one to try to give
		 * from among all it can give.
		 *
		 * If a monster can give 4 intrinsics then you have
		 * a 1/1 * 1/2 * 2/3 * 3/4 = 1/4 chance of getting the first,
		 * a 1/2 * 2/3 * 3/4 = 1/4 chance of getting the second,
		 * a 1/3 * 3/4 = 1/4 chance of getting the third,
		 * and a 1/4 chance of getting the fourth.
		 *
		 * And now a proof by induction:
		 * it works for 1 intrinsic (1 in 1 of getting it)
		 * for 2 you have a 1 in 2 chance of getting the second,
		 *	otherwise you keep the first
		 * for 3 you have a 1 in 3 chance of getting the third,
		 *	otherwise you keep the first or the second
		 * for n+1 you have a 1 in n+1 chance of getting the (n+1)st,
		 *	otherwise you keep the previous one.
		 * Elliott Kleinrock, October 5, 1990
		 */

		 count = 0;	/* number of possible intrinsics */
		 tmp = 0;	/* which one we will try to give */
		 for (i = 1; i <= LAST_PROP; i++) {
			if (intrinsic_possible(i, ptr)) {
				count++;
				/* a 1 in count chance of replacing the old
				 * one with this one, and a count-1 in count
				 * chance of keeping the old one.  (note
				 * that 1 in 1 and 0 in 1 are what we want
				 * for the first one
				 */
				if (!rn2(count))
					tmp = i;
			}
		 }

		 /* if any found try to give them one */
		 if (count) givit(tmp, ptr);
	    }
	    break;
	}

	if (catch_lycanthropy && defends(AD_WERE, uwep)) {
	    if (!touch_artifact(uwep, &youmonst)) {
		dropx(uwep);
		uwepgone();
	    }
	}

	return;
}